

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<long_double>_>::MultiplyByScalar
          (TPZMatrix<std::complex<long_double>_> *this,complex<long_double> alpha,
          TPZMatrix<std::complex<long_double>_> *res)

{
  long *in_RSI;
  undefined8 in_RDI;
  TPZFMatrix<std::complex<long_double>_> *this_00;
  complex<long_double> in_stack_ffffffffffffff20;
  
  this_00 = (TPZFMatrix<std::complex<long_double>_> *)&stack0x00000008;
  (**(code **)(*in_RSI + 0xf8))(in_RSI,in_RDI);
  Storage((TPZMatrix<std::complex<long_double>_> *)&stack0xffffffffffffff30);
  TPZFMatrix<std::complex<long_double>_>::operator*=(this_00,in_stack_ffffffffffffff20);
  TPZFMatrixRef<std::complex<long_double>_>::~TPZFMatrixRef
            ((TPZFMatrixRef<std::complex<long_double>_> *)0x12bc1f3);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultiplyByScalar(const TVar alpha, TPZMatrix<TVar>&res) const
{
  res.CopyFrom(this);
  res.Storage() *= alpha;
}